

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int gauden_normalize(float64 ***out,gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  uVar1 = g->n_mgau;
  uVar4 = 0;
  do {
    if (uVar4 == uVar1) {
      return 0;
    }
    uVar2 = g->n_feat;
    for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
      uVar3 = g->n_top;
      dVar7 = 0.0;
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        dVar7 = dVar7 + (double)out[uVar4][uVar5][uVar6];
      }
      if ((dVar7 == 0.0) && (!NAN(dVar7))) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                ,0x5af,"densities for feature %u sum to zero\n");
        return -1;
      }
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        out[uVar4][uVar5][uVar6] = (float64)((double)out[uVar4][uVar5][uVar6] / dVar7);
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int
gauden_normalize(float64 ***out,
		 gauden_t *g)
{
    float64 sum;
    uint32 i, j, k;
    int ret = S3_SUCCESS;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    sum = 0;

	    for (k = 0; k < g->n_top; k++) {
		sum += out[i][j][k];
	    }

	    if (sum != 0) {
		for (k = 0; k < g->n_top; k++) {
		    out[i][j][k] /= sum;
		}
	    }
	    else {
		E_ERROR("densities for feature %u sum to zero\n", j);

		return S3_ERROR;
	    }
	}
    }

    return ret;
}